

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O3

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
* docopt::docopt_parse
            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
             *__return_storage_ptr__,string *doc,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *argv,bool help,bool version,bool options_first)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  element_type *peVar3;
  pointer this;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  iter;
  pointer psVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  undefined8 uVar6;
  int iVar7;
  Pattern *pPVar8;
  undefined4 extraout_var;
  mapped_type *pmVar9;
  undefined4 extraout_var_00;
  runtime_error *prVar10;
  shared_ptr<docopt::LeafPattern> *p;
  pointer psVar11;
  undefined3 in_register_00000081;
  undefined4 uVar12;
  undefined4 in_register_00000084;
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  collected;
  string leftover;
  vector<docopt::Option,_std::allocator<docopt::Option>_> options;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  PatternList local_138;
  BranchPattern local_118;
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  undefined1 local_b8 [32];
  vector<docopt::Option,_std::allocator<docopt::Option>_> local_98;
  BranchPattern local_78;
  Tokens local_58;
  
  uVar12 = CONCAT31(in_register_00000081,version);
  local_118.fChildren.
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.fChildren.
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.fChildren.
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8._0_8_ = (pointer)0x0;
  local_b8._8_8_ = (pointer)0x0;
  local_b8._16_8_ = (pointer)0x0;
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)local_b8);
  local_118.super_Pattern._vptr_Pattern = (_func_int **)&PTR_flat_001b8470;
  local_78.fChildren.
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super_Pattern._vptr_Pattern = (_func_int **)0x0;
  local_78.fChildren.
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  create_pattern_tree((pair<docopt::Required,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_>
                       *)local_b8,doc);
  local_158._M_dataplus._M_p = (pointer)&local_78;
  local_158._M_string_length = (size_type)&local_118;
  std::tuple<docopt::Required&,std::vector<docopt::Option,std::allocator<docopt::Option>>&>::
  operator=((tuple<docopt::Required&,std::vector<docopt::Option,std::allocator<docopt::Option>>&> *)
            &local_158,
            (pair<docopt::Required,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_> *
            )local_b8);
  std::vector<docopt::Option,_std::allocator<docopt::Option>_>::~vector(&local_98);
  local_b8._0_8_ = &PTR_flat_001b8680;
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)(local_b8 + 8));
  local_138.
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_d8,argv);
  local_58.fTokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_d8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_58.fTokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_d8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58.fTokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_d8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.fIndex = 0;
  local_58.fIsParsingArgv = true;
  parse_argv((PatternList *)&local_158,&local_58,
             (vector<docopt::Option,_std::allocator<docopt::Option>_> *)&local_78,options_first);
  local_b8._16_8_ =
       local_138.
       super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_b8._8_8_ =
       local_138.
       super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_b8._0_8_ =
       local_138.
       super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_138.
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_158.field_2._M_allocated_capacity;
  local_138.
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_158._M_dataplus._M_p;
  local_138.
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_158._M_string_length;
  local_158._M_dataplus._M_p = (pointer)0x0;
  local_158._M_string_length = 0;
  local_158.field_2._M_allocated_capacity = 0;
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)local_b8);
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)&local_158);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58.fTokens);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d8);
  extras(help,version,&local_138);
  local_f8.
  super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.
  super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar8 = BranchPattern::fix(&local_118);
  iVar7 = (*pPVar8->_vptr_Pattern[2])(pPVar8,&local_138,&local_f8);
  if ((char)iVar7 == '\0') {
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar10,"Arguments did not match expected patterns");
    *(undefined ***)prVar10 = &PTR__runtime_error_001b86d0;
    __cxa_throw(prVar10,&DocoptArgumentError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_138.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_138.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    Pattern::leaves((vector<docopt::LeafPattern_*,_std::allocator<docopt::LeafPattern_*>_> *)
                    local_b8,&local_118.super_Pattern);
    uVar6 = local_b8._8_8_;
    for (p_Var5 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_b8._0_8_;
        p_Var5 != (__shared_count<(__gnu_cxx::_Lock_policy)2> *)uVar6; p_Var5 = p_Var5 + 1) {
      peVar2 = ((__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *)&p_Var5->_M_pi)->_M_ptr
      ;
      iVar7 = (*peVar2->_vptr_Pattern[3])(peVar2);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
               ::operator[](__return_storage_ptr__,(key_type *)CONCAT44(extraout_var,iVar7));
      value::operator=(pmVar9,(value *)(peVar2 + 5));
    }
    psVar11 = local_f8.
              super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar4 = local_f8.
             super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_b8._0_8_ !=
        (__shared_count<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      operator_delete((void *)local_b8._0_8_);
      psVar11 = local_f8.
                super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar4 = local_f8.
               super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (; psVar11 != psVar4; psVar11 = psVar11 + 1) {
      peVar3 = (psVar11->super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      iVar7 = (*(peVar3->super_Pattern)._vptr_Pattern[3])(peVar3);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
               ::operator[](__return_storage_ptr__,(key_type *)CONCAT44(extraout_var_00,iVar7));
      value::operator=(pmVar9,&peVar3->fValue);
    }
    std::
    vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
    ::~vector(&local_f8);
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    ~vector(&local_138);
    std::vector<docopt::Option,_std::allocator<docopt::Option>_>::~vector
              ((vector<docopt::Option,_std::allocator<docopt::Option>_> *)&local_78);
    local_118.super_Pattern._vptr_Pattern = (_func_int **)&PTR_flat_001b8680;
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    ~vector(&local_118.fChildren);
    return __return_storage_ptr__;
  }
  this = (argv->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  iter._M_current =
       (argv->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,", ","");
  (anonymous_namespace)::
  join<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((string *)local_b8,(_anonymous_namespace_ *)this,iter,&local_158,
             (string *)CONCAT44(in_register_00000084,uVar12));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_158,"Unexpected argument: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
  std::runtime_error::runtime_error(prVar10,(string *)&local_158);
  *(undefined ***)prVar10 = &PTR__runtime_error_001b86d0;
  __cxa_throw(prVar10,&DocoptArgumentError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::map<std::string, value>
docopt::docopt_parse(std::string const& doc,
		     std::vector<std::string> const& argv,
		     bool help,
		     bool version,
		     bool options_first)
{
	//std::cout << "doc: " << doc << std::endl;
	//std::cout << "argv: " << argv << std::endl;
	
	Required pattern;
	std::vector<Option> options;
	try {
		std::tie(pattern, options) = create_pattern_tree(doc);
	} catch (Tokens::OptionError const& error) {
		throw DocoptLanguageError(error.what());
	}
	
	PatternList argv_patterns;
	try {
		argv_patterns = parse_argv(Tokens(argv), options, options_first);
	} catch (Tokens::OptionError const& error) {
		throw DocoptArgumentError(error.what());
	}
	
	extras(help, version, argv_patterns);
	
	std::vector<std::shared_ptr<LeafPattern>> collected;
	bool matched = pattern.fix().match(argv_patterns, collected);
	if (matched && argv_patterns.empty()) {
		std::map<std::string, value> ret;
		
		// (a.name, a.value) for a in (pattern.flat() + collected)
		for (auto* p : pattern.leaves()) {
			ret[p->name()] = p->getValue();
		}
		
		for (auto const& p : collected) {
			ret[p->name()] = p->getValue();
		}
		
		return ret;
	}
	
	if (matched) {
		std::string leftover = join(argv.begin(), argv.end(), ", ");
		throw DocoptArgumentError("Unexpected argument: " + leftover);
	}
	
	throw DocoptArgumentError("Arguments did not match expected patterns"); // BLEH. Bad error.
}